

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestResult::Clear(TestResult *this)

{
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::clear
            (&this->test_part_results_);
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::clear
            (&this->test_properties_);
  this->death_test_count_ = 0;
  this->elapsed_time_ = 0;
  return;
}

Assistant:

void TestResult::Clear() {
  test_part_results_.clear();
  test_properties_.clear();
  death_test_count_ = 0;
  elapsed_time_ = 0;
}